

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compression.cpp
# Opt level: O0

uchar * CVariableInt::Unpack(uchar *pSrc,int *pInOut)

{
  byte bVar1;
  int Sign;
  int *pInOut_local;
  uchar *pSrc_local;
  
  bVar1 = *pSrc;
  *pInOut = *pSrc & 0x3f;
  pSrc_local = pSrc;
  if ((*pSrc & 0x80) != 0) {
    pSrc_local = pSrc + 1;
    *pInOut = (*pSrc_local & 0x7f) << 6 | *pInOut;
    if ((*pSrc_local & 0x80) != 0) {
      pSrc_local = pSrc + 2;
      *pInOut = (*pSrc_local & 0x7f) << 0xd | *pInOut;
      if ((*pSrc_local & 0x80) != 0) {
        pSrc_local = pSrc + 3;
        *pInOut = (*pSrc_local & 0x7f) << 0x14 | *pInOut;
        if ((*pSrc_local & 0x80) != 0) {
          pSrc_local = pSrc + 4;
          *pInOut = (*pSrc_local & 0xf) << 0x1b | *pInOut;
        }
      }
    }
  }
  *pInOut = -((int)(uint)bVar1 >> 6 & 1U) ^ *pInOut;
  return pSrc_local + 1;
}

Assistant:

const unsigned char *CVariableInt::Unpack(const unsigned char *pSrc, int *pInOut)
{
	const int Sign = (*pSrc >> 6) & 1;
	*pInOut = *pSrc & 0x3F;

	do
	{
		if(!(*pSrc & 0x80))
			break;
		pSrc++;
		*pInOut |= (*pSrc & 0x7F) << 6;

		if(!(*pSrc & 0x80))
			break;
		pSrc++;
		*pInOut |= (*pSrc & 0x7F) << (6 + 7);

		if(!(*pSrc & 0x80))
			break;
		pSrc++;
		*pInOut |= (*pSrc & 0x7F) << (6 + 7 + 7);

		if(!(*pSrc & 0x80))
			break;
		pSrc++;
		*pInOut |= (*pSrc & 0x0F) << (6 + 7 + 7 + 7);
	} while(false);

	pSrc++;
	*pInOut ^= -Sign; // if(sign) *i = ~(*i)
	return pSrc;
}